

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::commandBindDescriptorsForLayer
          (ImageLoadStoreTestInstance *this,VkCommandBuffer cmdBuffer,
          VkPipelineLayout pipelineLayout,int layerNdx)

{
  VkImageView imageView;
  VkDevice device_00;
  DeviceInterface *vk_00;
  reference this_00;
  RefBase<vk::Handle<(vk::HandleType)22>_> *this_01;
  Handle<(vk::HandleType)22> *pHVar1;
  reference pvVar2;
  RefBase<vk::Handle<(vk::HandleType)13>_> *pRVar3;
  Handle<(vk::HandleType)13> *pHVar4;
  DescriptorSetUpdateBuilder *pDVar5;
  Location local_118;
  VkDescriptorSet local_110;
  Location local_f8;
  VkDescriptorSet local_f0;
  DescriptorSetUpdateBuilder local_e8;
  VkImageLayout local_a0;
  undefined4 uStack_9c;
  VkSampler local_98;
  undefined1 local_90 [8];
  VkDescriptorImageInfo descriptorDstImageInfo;
  VkSampler local_70;
  undefined1 local_68 [8];
  VkDescriptorImageInfo descriptorSrcImageInfo;
  VkImageView dstImageView;
  VkImageView srcImageView;
  VkDescriptorSet descriptorSet;
  DeviceInterface *vk;
  VkDevice device;
  int layerNdx_local;
  VkCommandBuffer cmdBuffer_local;
  ImageLoadStoreTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  device_00 = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                                 super_TestInstance.m_context);
  vk_00 = Context::getDeviceInterface
                    ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                     m_context);
  this_00 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            ::operator[](&this->m_allDescriptorSets,(long)layerNdx);
  this_01 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                       (this_00)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(this_01);
  srcImageView.m_internal = pHVar1->m_internal;
  pvVar2 = std::
           vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ::operator[](&this->m_allSrcImageViews,(long)layerNdx);
  pRVar3 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                      (pvVar2)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar3);
  imageView.m_internal = pHVar4->m_internal;
  pvVar2 = std::
           vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ::operator[](&this->m_allDstImageViews,(long)layerNdx);
  pRVar3 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                      (pvVar2)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar3);
  descriptorSrcImageInfo._16_8_ = pHVar4->m_internal;
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_70,0);
  descriptorDstImageInfo._16_8_ = imageView.m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_68,local_70,imageView,VK_IMAGE_LAYOUT_GENERAL);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_98,0);
  local_a0 = descriptorSrcImageInfo.imageLayout;
  uStack_9c = descriptorSrcImageInfo._20_4_;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_90,local_98,(VkImageView)descriptorSrcImageInfo._16_8_,
             VK_IMAGE_LAYOUT_GENERAL);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_e8);
  local_f0.m_internal = srcImageView.m_internal;
  local_f8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_e8,local_f0,&local_f8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      (VkDescriptorImageInfo *)local_68);
  local_110.m_internal = srcImageView.m_internal;
  local_118 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar5,local_110,&local_118,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      (VkDescriptorImageInfo *)local_90);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar5,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_e8);
  (*vk_00->_vptr_DeviceInterface[0x56])
            (vk_00,cmdBuffer,1,pipelineLayout.m_internal,0,1,&srcImageView,0,0);
  return;
}

Assistant:

void ImageLoadStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const VkDescriptorSet descriptorSet = **m_allDescriptorSets[layerNdx];
	const VkImageView	  srcImageView	= **m_allSrcImageViews[layerNdx];
	const VkImageView	  dstImageView	= **m_allDstImageViews[layerNdx];

	const VkDescriptorImageInfo descriptorSrcImageInfo = makeDescriptorImageInfo(DE_NULL, srcImageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorImageInfo descriptorDstImageInfo = makeDescriptorImageInfo(DE_NULL, dstImageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorSrcImageInfo)
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorDstImageInfo)
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
}